

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O1

bool crunch::progress_callback_func(uint32 percentage_complete,void *pUser_data_ptr)

{
  int iVar1;
  undefined4 in_register_0000003c;
  console *this;
  char buf [8];
  undefined4 local_20;
  undefined3 uStack_1c;
  undefined1 local_19;
  
  crnlib::console::disable_crlf((console *)CONCAT44(in_register_0000003c,percentage_complete));
  uStack_1c = 0x80808;
  local_20 = 0x8080808;
  local_19 = 0;
  iVar1 = 0x10;
  do {
    crnlib::console::progress((char *)&local_20);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  crnlib::console::progress("Processing: %u%%",percentage_complete);
  this = (console *)&local_20;
  uStack_1c = 0x202020;
  local_20 = 0x20202020;
  crnlib::console::progress((char *)this);
  crnlib::console::progress((char *)this);
  uStack_1c = 0x80808;
  local_20 = 0x8080808;
  crnlib::console::progress((char *)this);
  crnlib::console::progress((char *)this);
  crnlib::console::enable_crlf(this);
  return true;
}

Assistant:

static bool progress_callback_func(uint32 percentage_complete, void* pUser_data_ptr)
    {
        pUser_data_ptr;

        console::disable_crlf();

        char buf[8];
        for (uint32 i = 0; i < 7; i++)
        {
            buf[i] = 8;
        }
        buf[7] = '\0';

        for (uint32 i = 0; i < 130 / 8; i++)
        {
            console::progress(buf);
        }

        console::progress("Processing: %u%%", percentage_complete);

        for (uint32 i = 0; i < 7; i++)
        {
            buf[i] = ' ';
        }
        console::progress(buf);
        console::progress(buf);

        for (uint32 i = 0; i < 7; i++)
        {
            buf[i] = 8;
        }
        console::progress(buf);
        console::progress(buf);

        console::enable_crlf();

        return true;
    }